

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O0

self_type * __thiscall
viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator-
          (self_type *__return_storage_ptr__,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *this,self_type *other)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference lhs;
  const_reference rhs;
  reference this_00;
  type local_50;
  ulong local_30;
  size_t i;
  self_type *local_20;
  self_type *other_local;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *this_local;
  self_type *result;
  
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  sVar2 = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::size(&this->
                  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                );
  sVar3 = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::size(&local_20->
                  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                );
  if (sVar2 != sVar3) {
    __assert_fail("BaseType::size() == other.size() && \"Expression vector dimensions mismatch\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/viennamath/runtime/vector_expr.hpp"
                  ,0x4b,
                  "self_type viennamath::rt_vector_expr<>::operator-(const self_type &) const [InterfaceType = viennamath::rt_expression_interface<double>]"
                 );
  }
  i._7_1_ = 0;
  sVar2 = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::size(&local_20->
                  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                );
  rt_vector_expr(__return_storage_ptr__,sVar2);
  for (local_30 = 0; uVar1 = local_30,
      sVar2 = std::
              vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ::size(&local_20->
                      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                    ), uVar1 < sVar2; local_30 = local_30 + 1) {
    lhs = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::operator[](&this->
                        super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                       ,local_30);
    rhs = std::
          vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          ::operator[](&local_20->
                        super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                       ,local_30);
    viennamath::operator-(&local_50,lhs,rhs);
    this_00 = std::
              vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ::operator[](&__return_storage_ptr__->
                            super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                           ,local_30);
    rt_expr<viennamath::rt_expression_interface<double>_>::operator=(this_00,&local_50);
    rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

self_type operator-(self_type const & other) const
      {
        assert(BaseType::size() == other.size() && "Expression vector dimensions mismatch");

        self_type result(other.size());
        for (std::size_t i=0; i<other.size(); ++i)
          result[i] = (*this)[i] - other[i];

        return result;
      }